

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

int64_t spvtools::opt::Loop::GetResidualConditionValue
                  (Op condition,int64_t initial_value,int64_t step_value,size_t number_of_iterations
                  ,size_t factor)

{
  int64_t iVar1;
  
  iVar1 = (number_of_iterations % factor) * step_value + initial_value;
  if (condition - OpULessThanEqual < 2) {
    iVar1 = iVar1 + 1;
  }
  else if (condition - OpUGreaterThanEqual < 2) {
    return iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int64_t Loop::GetResidualConditionValue(spv::Op condition,
                                        int64_t initial_value,
                                        int64_t step_value,
                                        size_t number_of_iterations,
                                        size_t factor) {
  int64_t remainder =
      initial_value + (number_of_iterations % factor) * step_value;

  // We subtract or add one as the above formula calculates the remainder if the
  // loop where just less than or greater than. Adding or subtracting one should
  // give a functionally equivalent value.
  switch (condition) {
    case spv::Op::OpSGreaterThanEqual:
    case spv::Op::OpUGreaterThanEqual: {
      remainder -= 1;
      break;
    }
    case spv::Op::OpSLessThanEqual:
    case spv::Op::OpULessThanEqual: {
      remainder += 1;
      break;
    }

    default:
      break;
  }
  return remainder;
}